

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimate.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  vector<double,_std::allocator<double>_> *this;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_8;
  int sample_index_1;
  ostringstream error_message_7;
  int sample_index;
  vector<double,_std::allocator<double>_> input_data;
  istream *input_stream;
  ostringstream error_message_6;
  ifstream ifs;
  ostringstream error_message_5;
  char *input_file;
  ostringstream error_message_4;
  int num_input_files;
  ostringstream error_message_3;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  int decimation_period;
  int vector_length;
  int start_index;
  option *in_stack_ffffffffffffed08;
  int *in_stack_ffffffffffffed10;
  allocator *paVar5;
  undefined6 in_stack_ffffffffffffed18;
  undefined1 in_stack_ffffffffffffed1e;
  undefined1 in_stack_ffffffffffffed1f;
  allocator *in_stack_ffffffffffffed20;
  undefined7 in_stack_ffffffffffffed28;
  undefined1 in_stack_ffffffffffffed2f;
  ostream *in_stack_ffffffffffffed30;
  int *actual_write_size;
  undefined7 in_stack_ffffffffffffed48;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffed50;
  undefined8 in_stack_ffffffffffffed58;
  int in_stack_ffffffffffffed60;
  undefined1 in_stack_ffffffffffffed66;
  undefined4 in_stack_ffffffffffffed70;
  _Ios_Openmode in_stack_ffffffffffffed74;
  char *local_1278;
  bool local_124a;
  bool local_121a;
  bool local_11ea;
  bool local_11c2;
  allocator local_11a1;
  string local_11a0 [32];
  ostringstream local_1180 [120];
  ostringstream *in_stack_ffffffffffffeef8;
  string *in_stack_ffffffffffffef00;
  int local_1008;
  allocator local_1001;
  string local_1000 [32];
  ostringstream local_fe0 [376];
  int local_e68;
  int *local_e48;
  undefined4 local_e40;
  allocator local_e39;
  string local_e38 [32];
  ostringstream local_e18 [376];
  int local_ca0 [131];
  allocator local_a91;
  string local_a90 [32];
  ostringstream local_a70 [376];
  char *local_8f8;
  allocator local_8e9;
  string local_8e8 [32];
  ostringstream local_8c8 [376];
  int local_750;
  allocator local_749;
  string local_748 [32];
  ostringstream local_728 [383];
  allocator local_5a9;
  string local_5a8 [39];
  allocator local_581;
  string local_580 [32];
  ostringstream local_560 [383];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [32];
  ostringstream local_398 [383];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  ostringstream local_1d0 [399];
  allocator local_41;
  string local_40 [32];
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0;
  local_18 = 1;
  local_1c = 10;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_20 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffed20 >> 0x20),
                                   (char **)CONCAT17(in_stack_ffffffffffffed1f,
                                                     CONCAT16(in_stack_ffffffffffffed1e,
                                                              in_stack_ffffffffffffed18)),
                                   (char *)in_stack_ffffffffffffed10,in_stack_ffffffffffffed08,
                                   (int *)0x1036d5), pcVar1 = ya_optarg, local_20 != -1) {
    switch(local_20) {
    case 0x68:
      anon_unknown.dwarf_1729::PrintUsage(in_stack_ffffffffffffed30);
      return 0;
    default:
      anon_unknown.dwarf_1729::PrintUsage(in_stack_ffffffffffffed30);
      return 1;
    case 0x6c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,pcVar1,&local_41);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)
                         CONCAT17(in_stack_ffffffffffffed1f,
                                  CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
                         in_stack_ffffffffffffed10);
      local_11c2 = !bVar2 || local_18 < 1;
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      if (local_11c2) {
        std::__cxx11::ostringstream::ostringstream(local_1d0);
        std::operator<<((ostream *)local_1d0,
                        "The argument for the -l option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f0,"decimate",&local_1f1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d0);
        return local_4;
      }
      break;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_218,pcVar1,&local_219);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)
                         CONCAT17(in_stack_ffffffffffffed1f,
                                  CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
                         in_stack_ffffffffffffed10);
      local_11ea = !bVar2 || local_18 < 0;
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      if (local_11ea) {
        std::__cxx11::ostringstream::ostringstream(local_398);
        poVar4 = std::operator<<((ostream *)local_398,"The argument for the -m option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3b8,"decimate",&local_3b9);
        sptk::PrintErrorMessage(in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
        std::__cxx11::string::~string(local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_398);
        return local_4;
      }
      local_18 = local_18 + 1;
      break;
    case 0x70:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5a8,pcVar1,&local_5a9);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)
                         CONCAT17(in_stack_ffffffffffffed1f,
                                  CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
                         in_stack_ffffffffffffed10);
      local_124a = !bVar2 || local_1c < 1;
      std::__cxx11::string::~string(local_5a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
      if (local_124a) {
        std::__cxx11::ostringstream::ostringstream(local_728);
        std::operator<<((ostream *)local_728,
                        "The argument for the -p option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_748,"decimate",&local_749);
        sptk::PrintErrorMessage(in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
        std::__cxx11::string::~string(local_748);
        std::allocator<char>::~allocator((allocator<char> *)&local_749);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_728);
        return local_4;
      }
      break;
    case 0x73:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e0,pcVar1,&local_3e1);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)
                         CONCAT17(in_stack_ffffffffffffed1f,
                                  CONCAT16(in_stack_ffffffffffffed1e,in_stack_ffffffffffffed18)),
                         in_stack_ffffffffffffed10);
      local_121a = !bVar2 || local_14 < 0;
      std::__cxx11::string::~string(local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
      if (local_121a) {
        std::__cxx11::ostringstream::ostringstream(local_560);
        poVar4 = std::operator<<((ostream *)local_560,"The argument for the -s option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_580,"decimate",&local_581);
        sptk::PrintErrorMessage(in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
        std::__cxx11::string::~string(local_580);
        std::allocator<char>::~allocator((allocator<char> *)&local_581);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_560);
        return local_4;
      }
    }
  }
  local_750 = local_8 - ya_optind;
  if (1 < local_750) {
    std::__cxx11::ostringstream::ostringstream(local_8c8);
    std::operator<<((ostream *)local_8c8,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8e8,"decimate",&local_8e9);
    sptk::PrintErrorMessage(in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
    std::__cxx11::string::~string(local_8e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_8c8);
    return local_4;
  }
  if (local_750 == 0) {
    local_1278 = (char *)0x0;
  }
  else {
    local_1278 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_8f8 = local_1278;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_a70);
    std::operator<<((ostream *)local_a70,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a90,"decimate",&local_a91);
    sptk::PrintErrorMessage(in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
    std::__cxx11::string::~string(local_a90);
    std::allocator<char>::~allocator((allocator<char> *)&local_a91);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_a70);
    return local_4;
  }
  std::ifstream::ifstream(local_ca0);
  pcVar1 = local_8f8;
  if (local_8f8 != (char *)0x0) {
    in_stack_ffffffffffffed74 = std::operator|(_S_in,_S_bin);
    std::ifstream::open((char *)local_ca0,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_e18);
      poVar4 = std::operator<<((ostream *)local_e18,"Cannot open file ");
      std::operator<<(poVar4,local_8f8);
      paVar5 = &local_e39;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e38,"decimate",paVar5);
      sptk::PrintErrorMessage(in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
      std::__cxx11::string::~string(local_e38);
      std::allocator<char>::~allocator((allocator<char> *)&local_e39);
      local_4 = 1;
      local_e40 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_e18);
      goto LAB_0010491f;
    }
  }
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    actual_write_size = (int *)&std::cin;
  }
  else {
    actual_write_size = local_ca0;
  }
  this = (vector<double,_std::allocator<double>_> *)(long)local_18;
  local_e48 = actual_write_size;
  std::allocator<double>::allocator((allocator<double> *)0x10452a);
  std::vector<double,_std::allocator<double>_>::vector
            (this,CONCAT17(in_stack_ffffffffffffed2f,in_stack_ffffffffffffed28),
             (allocator_type *)in_stack_ffffffffffffed20);
  std::allocator<double>::~allocator((allocator<double> *)0x104550);
  for (local_e68 = 0; local_e68 < local_14; local_e68 = local_e68 + 1) {
    bVar2 = sptk::ReadStream<double>
                      ((bool)in_stack_ffffffffffffed66,in_stack_ffffffffffffed60,
                       (int)((ulong)in_stack_ffffffffffffed58 >> 0x20),
                       (int)in_stack_ffffffffffffed58,in_stack_ffffffffffffed50,
                       (istream *)CONCAT17(bVar3,in_stack_ffffffffffffed48),
                       (int *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70));
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_fe0);
      std::operator<<((ostream *)local_fe0,"Start index exceeds data length");
      in_stack_ffffffffffffed20 = &local_1001;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1000,"decimate",in_stack_ffffffffffffed20);
      sptk::PrintErrorMessage(in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
      std::__cxx11::string::~string(local_1000);
      std::allocator<char>::~allocator((allocator<char> *)&local_1001);
      local_4 = 1;
      local_e40 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_fe0);
      goto LAB_00104901;
    }
  }
  local_1008 = 0;
  while (bVar2 = sptk::ReadStream<double>
                           ((bool)in_stack_ffffffffffffed66,in_stack_ffffffffffffed60,
                            (int)((ulong)in_stack_ffffffffffffed58 >> 0x20),
                            (int)in_stack_ffffffffffffed58,in_stack_ffffffffffffed50,
                            (istream *)CONCAT17(bVar3,in_stack_ffffffffffffed48),
                            (int *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70)),
        bVar2) {
    if (local_1008 % local_1c == 0) {
      bVar2 = sptk::WriteStream<double>
                        (in_stack_ffffffffffffed60,(int)((ulong)in_stack_ffffffffffffed58 >> 0x20),
                         in_stack_ffffffffffffed50,
                         (ostream *)CONCAT17(bVar3,in_stack_ffffffffffffed48),actual_write_size);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_1180);
        std::operator<<((ostream *)local_1180,"Failed to write decimated data sequence");
        paVar5 = &local_11a1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_11a0,"decimate",paVar5);
        sptk::PrintErrorMessage(in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
        std::__cxx11::string::~string(local_11a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_11a1);
        local_4 = 1;
        local_e40 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1180);
        goto LAB_00104901;
      }
      local_1008 = 0;
    }
    local_1008 = local_1008 + 1;
  }
  local_4 = 0;
  local_e40 = 1;
LAB_00104901:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffed20);
LAB_0010491f:
  std::ifstream::~ifstream(local_ca0);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int start_index(kDefaultStartIndex);
  int vector_length(kDefaultVectorLength);
  int decimation_period(kDefaultDecimationPeriod);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:s:p:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("decimate", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("decimate", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &start_index) ||
            start_index < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("decimate", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &decimation_period) ||
            decimation_period <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("decimate", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("decimate", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("decimate", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("decimate", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  std::vector<double> input_data(vector_length);

  // Skip data.
  for (int sample_index(0); sample_index < start_index; ++sample_index) {
    if (!sptk::ReadStream(false, 0, 0, vector_length, &input_data,
                          &input_stream, NULL)) {
      std::ostringstream error_message;
      error_message << "Start index exceeds data length";
      sptk::PrintErrorMessage("decimate", error_message);
      return 1;
    }
  }

  for (int sample_index(0); sptk::ReadStream(false, 0, 0, vector_length,
                                             &input_data, &input_stream, NULL);
       ++sample_index) {
    if (0 == sample_index % decimation_period) {
      if (!sptk::WriteStream(0, vector_length, input_data, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write decimated data sequence";
        sptk::PrintErrorMessage("decimate", error_message);
        return 1;
      }
      sample_index = 0;
    }
  }

  return 0;
}